

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.cc
# Opt level: O1

int audio_main(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  Api api;
  FILE *pFVar4;
  bool bVar5;
  uint uVar6;
  RtAudioErrorType RVar7;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  RtAudio audio_client;
  uint buffer_size;
  double local_1f8;
  RtMidiIn midi_client;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  string midi_port_name;
  StreamParameters stream_param;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  Audio_Context ctx;
  DeviceInfo device_info;
  StreamOptions stream_opts;
  Ring_Buffer midi_rb;
  
  ctx.midi_delta = 0.0;
  ctx.midi_stream_started = false;
  ctx.midi_timestamp_accum = 0.0;
  ctx.midi_rb = (Ring_Buffer *)0x0;
  ctx.audio_client._0_4_ = 0;
  ctx.audio_client._4_4_ = 0;
  ctx.midi_client._0_4_ = 0;
  ctx.midi_client._4_4_ = 0;
  ctx.sample_rate = 0;
  Ring_Buffer_Ex<true>::Ring_Buffer_Ex(&midi_rb,0x10000);
  device_info.name._M_dataplus._M_p = (pointer)0x0;
  device_info._0_8_ = audio_error_callback;
  device_info.name.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  device_info.name._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  ctx.midi_rb = &midi_rb;
  RtAudio::RtAudio(&audio_client,arg_audio_api,(RtAudioErrorCallback *)&device_info);
  if (device_info.name._M_string_length != 0) {
    (*(code *)device_info.name._M_string_length)(&device_info,&device_info,3);
  }
  api = arg_midi_api;
  psVar1 = &device_info.name._M_string_length;
  device_info._0_8_ = psVar1;
  ctx.audio_client = &audio_client;
  std::__cxx11::string::_M_construct<char_const*>((string *)&device_info,"ADLrt","");
  RtMidiIn::RtMidiIn(&midi_client,api,(string *)&device_info,0x10000);
  if ((size_type *)device_info._0_8_ != psVar1) {
    operator_delete((void *)device_info._0_8_);
  }
  ctx.midi_client = &midi_client;
  uVar6 = RtApi::getDeviceCount(audio_client.rtapi_);
  if (uVar6 == 0) {
    audio_main();
    uVar6 = 1;
  }
  else {
    uVar6 = (*(audio_client.rtapi_)->_vptr_RtApi[4])();
    RtApi::getDeviceInfo(&device_info,audio_client.rtapi_,uVar6);
    ctx.sample_rate = device_info.preferredSampleRate;
    stream_param.nChannels = 2;
    stream_param.firstChannel = 0;
    paVar2 = &stream_opts.streamName.field_2;
    stream_opts.streamName._M_string_length = 0;
    stream_opts.streamName.field_2._M_local_buf[0] = '\0';
    stream_opts.priority = 0;
    stream_opts._0_8_ = (ulong)((arg_autoconnect ^ 1) << 5) | 0x10;
    stream_param.deviceId = uVar6;
    stream_opts.streamName._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)&stream_opts.streamName,0,(char *)0x0,0x198040);
    local_1f8 = arg_latency;
    dVar3 = ceil(arg_latency * (double)device_info.preferredSampleRate);
    pFVar4 = _stderr;
    buffer_size = (uint)(long)dVar3;
    pcVar8 = (char *)gettext("Desired latency %f ms = buffer size %u\n");
    fprintf(pFVar4,pcVar8,SUB84(local_1f8 * 1000.0,0),(ulong)buffer_size);
    RVar7 = RtAudio::openStream(&audio_client,&stream_param,(StreamParameters *)0x0,0x10,
                                device_info.preferredSampleRate,&buffer_size,process,&ctx,
                                &stream_opts);
    uVar6 = 1;
    if (RVar7 < RTAUDIO_UNKNOWN_ERROR) {
      MidiInApi::setCallback((MidiInApi *)midi_client.super_RtMidi.rtapi_,rtmidi_event,&ctx);
      MidiApi::setErrorCallback(midi_client.super_RtMidi.rtapi_,midi_error_callback,(void *)0x0);
      midi_port_name._M_dataplus._M_p = (pointer)&midi_port_name.field_2;
      midi_port_name._M_string_length = 0;
      midi_port_name.field_2._M_local_buf[0] = '\0';
      (*(midi_client.super_RtMidi.rtapi_)->_vptr_MidiApi[2])();
      std::__cxx11::string::_M_replace
                ((ulong)&midi_port_name,0,(char *)midi_port_name._M_string_length,0x1980ae);
      std::__cxx11::string::string
                ((string *)&local_1b8,midi_port_name._M_dataplus._M_p,(allocator *)&local_148);
      (*(midi_client.super_RtMidi.rtapi_)->_vptr_MidiApi[4])
                (midi_client.super_RtMidi.rtapi_,&local_1b8);
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ADLrt","");
      plVar9 = (long *)std::__cxx11::string::append((char *)local_168);
      local_1d8 = (long *)*plVar9;
      plVar10 = plVar9 + 2;
      if (local_1d8 == plVar10) {
        local_1c8 = *plVar10;
        lStack_1c0 = plVar9[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar10;
      }
      local_1d0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d8,(ulong)midi_port_name._M_dataplus._M_p);
      local_148 = (long *)*plVar9;
      plVar10 = plVar9 + 2;
      if (local_148 == plVar10) {
        local_138 = *plVar10;
        lStack_130 = plVar9[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar10;
      }
      local_140 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_1b8 = (long *)*plVar9;
      plVar10 = plVar9 + 2;
      if (local_1b8 == plVar10) {
        local_1a8 = *plVar10;
        lStack_1a0 = plVar9[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *plVar10;
      }
      local_1b0 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)&program_title_abi_cxx11_,(string *)&local_1b8);
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0]);
      }
      pFVar4 = _stderr;
      local_1f8 = (double)buffer_size / (double)device_info.preferredSampleRate;
      pcVar8 = (char *)gettext("RtAudio client \"%s\" fs=%u bs=%u latency=%f\n");
      fprintf(pFVar4,pcVar8,SUB84(local_1f8,0),device_info.name._M_dataplus._M_p,
              (ulong)device_info.preferredSampleRate,(ulong)buffer_size);
      bVar5 = initialize_player(arg_player_type,device_info.preferredSampleRate,arg_nchip,
                                arg_bankfile,arg_emulator,false);
      if (bVar5) {
        (*(audio_client.rtapi_)->_vptr_RtApi[6])();
        player_ready(false);
        interface_exec((_func_void_void_ptr *)0x0,(void *)0x0);
        (*(audio_client.rtapi_)->_vptr_RtApi[7])();
        (*(midi_client.super_RtMidi.rtapi_)->_vptr_MidiApi[5])();
      }
      uVar6 = (uint)!bVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)midi_port_name._M_dataplus._M_p != &midi_port_name.field_2) {
        operator_delete(midi_port_name._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)stream_opts.streamName._M_dataplus._M_p != paVar2) {
      operator_delete(stream_opts.streamName._M_dataplus._M_p);
    }
    if (device_info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(device_info.sampleRates.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)device_info.name._M_dataplus._M_p != &device_info.name.field_2) {
      operator_delete(device_info.name._M_dataplus._M_p);
    }
  }
  RtMidiIn::~RtMidiIn(&midi_client);
  RtAudio::~RtAudio(&audio_client);
  Ring_Buffer_Ex<true>::~Ring_Buffer_Ex(&midi_rb);
  return uVar6;
}

Assistant:

int audio_main()
{
    Audio_Context ctx;
    Ring_Buffer midi_rb(midi_buffer_size);
    ctx.midi_rb = &midi_rb;

#if defined(RTAUDIO_VERSION_6)
    RtAudio audio_client(::arg_audio_api, &audio_error_callback);
#else
    RtAudio audio_client(::arg_audio_api);
#endif
    ctx.audio_client = &audio_client;
    RtMidiIn midi_client(::arg_midi_api, "ADLrt", midi_buffer_size);
    ctx.midi_client = &midi_client;

    unsigned num_audio_devices = audio_client.getDeviceCount();
    if (num_audio_devices == 0) {
        fprintf(stderr, "%s\n", _("No audio devices are present for output."));
        return 1;
    }

    unsigned output_device_id = audio_client.getDefaultOutputDevice();
    RtAudio::DeviceInfo device_info = audio_client.getDeviceInfo(output_device_id);
    unsigned sample_rate = device_info.preferredSampleRate;
    ctx.sample_rate = sample_rate;

    RtAudio::StreamParameters stream_param;
    stream_param.deviceId = output_device_id;
    stream_param.nChannels = 2;

    RtAudio::StreamOptions stream_opts;
    stream_opts.flags = RTAUDIO_ALSA_USE_DEFAULT;
    if (!arg_autoconnect)
        stream_opts.flags |= RTAUDIO_JACK_DONT_CONNECT;
    stream_opts.streamName = "ADLrt";

    double latency = ::arg_latency;
    unsigned buffer_size = ceil(latency * sample_rate);
    fprintf(stderr, _("Desired latency %f ms = buffer size %u\n"),
            latency * 1e3, buffer_size);

#if defined(RTAUDIO_VERSION_6)
    RtAudioErrorType err = audio_client.openStream(&stream_param, nullptr, RTAUDIO_FLOAT32,
                                                   sample_rate, &buffer_size, &process,
                                                   &ctx, &stream_opts);

    if(err != RTAUDIO_NO_ERROR && err != RTAUDIO_WARNING)
        return 1;
#else
    audio_client.openStream(
        &stream_param, nullptr, RTAUDIO_FLOAT32, sample_rate, &buffer_size,
        &process, &ctx, &stream_opts, &audio_error_callback);
#endif

    midi_client.setCallback(&rtmidi_event, &ctx);
    midi_client.setErrorCallback(&midi_error_callback);

#if defined(ADLJACK_ENABLE_VIRTUALMIDI)
    VM_MIDI_PORT_u vmidi_port;
    ctx.have_virtualmidi = vmidi_init();
#endif

    std::string midi_port_name;

    switch (midi_client.getCurrentApi()) {
    default:
        midi_port_name = "ADLrt MIDI";
        midi_client.openVirtualPort(midi_port_name.c_str());
        break;
#if defined(_WIN32)
    case RtMidi::WINDOWS_MM: {
        switch(int port = dlg_select_midi_port(ctx)) {
        default:
            midi_client.openPort(port, "ADLrt MIDI");
            midi_port_name = midi_client.getPortName(port);
            break;
        case -1:
            return 1;
#if defined(ADLJACK_ENABLE_VIRTUALMIDI)
        case -2:
            vmidi_port = vmidi_port_setup(ctx, midi_port_name);
            if (!vmidi_port)
                return 1;
            ctx.vmidi_port = vmidi_port.get();
            break;
#endif
        }
        break;
    }
#endif
    }

    ::program_title = std::string("ADLrt") + " [" + midi_port_name + "]";

    latency = buffer_size / (double)sample_rate;
    fprintf(stderr, _("RtAudio client \"%s\" fs=%u bs=%u latency=%f\n"),
            device_info.name.c_str(), sample_rate, buffer_size, latency);

    if (!initialize_player(arg_player_type, sample_rate, arg_nchip, arg_bankfile, arg_emulator))
        return 1;

    audio_client.startStream();
    player_ready();

    //
    interface_exec(nullptr, nullptr);

    //
    audio_client.stopStream();
    midi_client.closePort();
#if defined(ADLJACK_ENABLE_VIRTUALMIDI)
    vmidi_port.reset();
#endif

    return 0;
}